

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O0

void __thiscall
prometheus::Exposer::RegisterCollectable
          (Exposer *this,weak_ptr<prometheus::Collectable> *collectable,string *uri)

{
  Endpoint *this_00;
  Endpoint *endpoint;
  lock_guard<std::mutex> lock;
  string *uri_local;
  weak_ptr<prometheus::Collectable> *collectable_local;
  Exposer *this_local;
  
  lock._M_device = (mutex_type *)uri;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&endpoint,&this->mutex_);
  this_00 = GetEndpointForUri(this,(string *)lock._M_device);
  detail::Endpoint::RegisterCollectable(this_00,collectable);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&endpoint);
  return;
}

Assistant:

void Exposer::RegisterCollectable(const std::weak_ptr<Collectable>& collectable,
                                  const std::string& uri) {
  std::lock_guard<std::mutex> lock{mutex_};
  auto& endpoint = GetEndpointForUri(uri);
  endpoint.RegisterCollectable(collectable);
}